

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool BasePort::ParseProtocol(char *arg,ProtocolType *protocol,ostream *ostr)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  bool bVar4;
  ProtocolType PVar5;
  string name;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((arg == (char *)0x0) || (*arg == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,"ParseProtocol: no protocol provided",0x23);
    std::ios::widen((char)*(undefined8 *)(*(long *)ostr + -0x18) + (char)ostr);
    std::ostream::put((char)ostr);
    std::ostream::flush();
    return false;
  }
  local_50 = local_40;
  sVar2 = strlen(arg);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,arg,arg + sVar2);
  iVar1 = std::__cxx11::string::compare((char *)&local_50);
  PVar5 = PROTOCOL_SEQ_RW;
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)&local_50), iVar1 != 0)) {
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    PVar5 = PROTOCOL_SEQ_R_BC_W;
    if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)&local_50), iVar1 != 0)) {
      iVar1 = std::__cxx11::string::compare((char *)&local_50);
      PVar5 = PROTOCOL_BC_QRW;
      if ((((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)&local_50), iVar1 != 0))
          && (iVar1 = std::__cxx11::string::compare((char *)&local_50), iVar1 != 0)) &&
         (iVar1 = std::__cxx11::string::compare((char *)&local_50), iVar1 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (ostr,"ParseProtocol: no protocol \"",0x1c);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)local_50,local_48);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,
                   "\" is not supported, use sequential-read-write, srw, sequential-read-broadcast-write, srbw, broadcast-query-read-write or bqrw"
                   ,0x7d);
        std::endl<char,std::char_traits<char>>(poVar3);
        bVar4 = false;
        goto LAB_00109d75;
      }
    }
  }
  *protocol = PVar5;
  bVar4 = true;
LAB_00109d75:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return bVar4;
}

Assistant:

bool BasePort::ParseProtocol(const char * arg, ProtocolType & protocol,
                             std::ostream & ostr)
{
    // no option, using default
    if ((arg == 0) || (strlen(arg) == 0)) {
        ostr << "ParseProtocol: no protocol provided" << std::endl;
        return false;
    }
    // convert arg to string
    std::string name(arg);

    // this could likely be implemented using a static map
    if ((name == "sequential-read-write") ||
        (name == "srw")) {
        protocol = PROTOCOL_SEQ_RW;
        return true;
    } else if ((name == "sequential-read-broadcast-write") ||
               (name == "srbw")) {
        protocol = PROTOCOL_SEQ_R_BC_W;
        return true;
    } else if ((name == "broadcast-read-write") ||
               (name == "brw") ||
               (name == "broadcast-query-read-write") ||
               (name == "bqrw")) {
        protocol = PROTOCOL_BC_QRW;
        return true;
    }
    ostr << "ParseProtocol: no protocol \"" << name << "\" is not supported, use sequential-read-write, srw, sequential-read-broadcast-write, srbw, broadcast-query-read-write or bqrw" << std::endl;
    return false;
}